

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
Rml::Context::UpdateHoverChain
          (Context *this,Vector2i old_mouse_position,int key_modifier_state,
          Dictionary *out_parameters,Dictionary *out_drag_parameters)

{
  bool bVar1;
  Drag DVar2;
  Mode MVar3;
  type pVVar4;
  pointer pSVar5;
  ComputedValues *pCVar6;
  SystemInterface *pSVar7;
  Element *pEVar8;
  Vector2<float> point;
  Element *local_1f8;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  *local_1b0;
  pointer *local_1a8;
  undefined1 local_188 [8];
  ElementSet new_drag_hover_chain;
  Element *local_158;
  Element *element;
  ElementSet new_hover_chain;
  String local_118;
  Vector2i local_f8;
  String local_f0;
  undefined1 local_d0 [8];
  String new_cursor_name;
  undefined1 local_a8 [8];
  Dictionary drag_start_parameters;
  Dictionary *drag_parameters;
  Dictionary *parameters;
  Dictionary local_drag_parameters;
  Dictionary local_parameters;
  Vector2f position;
  Dictionary *out_drag_parameters_local;
  Dictionary *out_parameters_local;
  int key_modifier_state_local;
  Context *this_local;
  Vector2i old_mouse_position_local;
  
  this_local = (Context *)old_mouse_position;
  point = Vector2::operator_cast_to_Vector2((Vector2 *)&this->mouse_position);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)&local_drag_parameters.m_container.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)&parameters);
  local_1a8 = (pointer *)out_parameters;
  if (out_parameters == (Dictionary *)0x0) {
    local_1a8 = &local_drag_parameters.m_container.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_1b0 = out_drag_parameters;
  if (out_drag_parameters == (Dictionary *)0x0) {
    local_1b0 = (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                 *)&parameters;
  }
  GenerateMouseEventParameters(this,(Dictionary *)local_1a8,-1);
  GenerateKeyModifierEventParameters(this,(Dictionary *)local_1a8,key_modifier_state);
  GenerateMouseEventParameters(this,local_1b0,-1);
  GenerateDragEventParameters(this,local_1b0);
  GenerateKeyModifierEventParameters(this,local_1b0,key_modifier_state);
  if (this->drag != (Element *)0x0) {
    drag_start_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
    bVar1 = Vector2<int>::operator!=(&this->mouse_position,(Vector2<int>)this_local);
    if (bVar1) {
      if ((this->drag_started & 1U) == 0) {
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                    *)local_a8,local_1b0);
        pVVar4 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[8]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_a8,(char (*) [8])"mouse_x");
        Variant::operator=(pVVar4,(int *)&this_local);
        pVVar4 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[8]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_a8,(char (*) [8])"mouse_y");
        Variant::operator=(pVVar4,(int *)((long)&this_local + 4));
        Element::DispatchEvent(this->drag,Dragstart,(Dictionary *)local_a8);
        this->drag_started = true;
        pCVar6 = Element::GetComputedValues(this->drag);
        DVar2 = Style::ComputedValues::drag(pCVar6);
        if (DVar2 == Clone) {
          CreateDragClone(this,this->drag);
        }
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                     *)local_a8);
      }
      Element::DispatchEvent(this->drag,Drag,local_1b0);
    }
  }
  if ((this->mouse_active & 1U) == 0) {
    local_1f8 = (Element *)0x0;
  }
  else {
    new_cursor_name.field_2._8_8_ = point;
    local_1f8 = GetElementAtPoint(this,point,(Element *)0x0,(Element *)0x0);
  }
  this->hover = local_1f8;
  if ((this->enable_cursor & 1U) != 0) {
    ::std::__cxx11::string::string((string *)local_d0);
    pSVar5 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    MVar3 = ScrollController::GetMode(pSVar5);
    if (MVar3 == Autoscroll) {
      pSVar5 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ::operator->(&this->scroll_controller);
      local_f8 = this->mouse_position;
      ScrollController::GetAutoscrollCursor_abi_cxx11_
                (&local_f0,pSVar5,local_f8,this->density_independent_pixel_ratio);
      ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      ::std::__cxx11::string::~string((string *)&local_f0);
    }
    else if (this->drag == (Element *)0x0) {
      if (this->hover != (Element *)0x0) {
        pCVar6 = Element::GetComputedValues(this->hover);
        Style::ComputedValues::cursor_abi_cxx11_
                  ((String *)
                   &new_hover_chain.m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pCVar6);
        ::std::__cxx11::string::operator=
                  ((string *)local_d0,
                   (string *)
                   &new_hover_chain.m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &new_hover_chain.m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      pCVar6 = Element::GetComputedValues(this->drag);
      Style::ComputedValues::cursor_abi_cxx11_(&local_118,pCVar6);
      ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
    }
    bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,&this->cursor_name);
    if (bVar1) {
      pSVar7 = GetSystemInterface();
      (*pSVar7->_vptr_SystemInterface[6])(pSVar7,local_d0);
      ::std::__cxx11::string::operator=((string *)&this->cursor_name,(string *)local_d0);
    }
    ::std::__cxx11::string::~string((string *)local_d0);
  }
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::flat_set((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
              *)&element);
  for (local_158 = this->hover; local_158 != (Element *)0x0;
      local_158 = Element::GetParentNode(local_158)) {
    itlib::
    flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::insert<Rml::Element*&>
              ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)&element,&local_158);
  }
  SendEvents(&this->hover_chain,(ElementSet *)&element,Mouseout,(Dictionary *)local_1a8);
  SendEvents((ElementSet *)&element,&this->hover_chain,Mouseover,(Dictionary *)local_1a8);
  if ((this->drag != (Element *)0x0) && ((this->mouse_active & 1U) != 0)) {
    new_drag_hover_chain.m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)point;
    pEVar8 = GetElementAtPoint(this,point,this->drag,(Element *)0x0);
    this->drag_hover = pEVar8;
    itlib::
    flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
    ::flat_set((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                *)local_188);
    for (local_158 = this->drag_hover; local_158 != (Element *)0x0;
        local_158 = Element::GetParentNode(local_158)) {
      itlib::
      flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
      ::insert<Rml::Element*&>
                ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                  *)local_188,&local_158);
    }
    if (((this->drag_started & 1U) != 0) && ((this->drag_verbose & 1U) != 0)) {
      SendEvents(&this->drag_hover_chain,(ElementSet *)local_188,Dragout,local_1b0);
      SendEvents((ElementSet *)local_188,&this->drag_hover_chain,Dragover,local_1b0);
    }
    itlib::
    flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
    ::swap(&this->drag_hover_chain,
           (flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
            *)local_188);
    itlib::
    flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
    ::~flat_set((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                 *)local_188);
  }
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::swap(&this->hover_chain,
         (flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
          *)&element);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::~flat_set((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
               *)&element);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)&parameters);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)&local_drag_parameters.m_container.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Context::UpdateHoverChain(Vector2i old_mouse_position, int key_modifier_state, Dictionary* out_parameters, Dictionary* out_drag_parameters)
{
	const Vector2f position(mouse_position);

	Dictionary local_parameters, local_drag_parameters;
	Dictionary& parameters = out_parameters ? *out_parameters : local_parameters;
	Dictionary& drag_parameters = out_drag_parameters ? *out_drag_parameters : local_drag_parameters;

	// Generate the parameters for the mouse events (there could be a few!).
	GenerateMouseEventParameters(parameters);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	GenerateMouseEventParameters(drag_parameters);
	GenerateDragEventParameters(drag_parameters);
	GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

	// Send out drag events.
	if (drag)
	{
		if (mouse_position != old_mouse_position)
		{
			if (!drag_started)
			{
				Dictionary drag_start_parameters = drag_parameters;
				drag_start_parameters["mouse_x"] = old_mouse_position.x;
				drag_start_parameters["mouse_y"] = old_mouse_position.y;
				drag->DispatchEvent(EventId::Dragstart, drag_start_parameters);
				drag_started = true;

				if (drag->GetComputedValues().drag() == Style::Drag::Clone)
				{
					// Clone the element and attach it to the mouse cursor.
					CreateDragClone(drag);
				}
			}

			drag->DispatchEvent(EventId::Drag, drag_parameters);
		}
	}

	hover = mouse_active ? GetElementAtPoint(position) : nullptr;

	if (enable_cursor)
	{
		String new_cursor_name;

		if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
			new_cursor_name = scroll_controller->GetAutoscrollCursor(mouse_position, density_independent_pixel_ratio);
		else if (drag)
			new_cursor_name = drag->GetComputedValues().cursor();
		else if (hover)
			new_cursor_name = hover->GetComputedValues().cursor();

		if (new_cursor_name != cursor_name)
		{
			GetSystemInterface()->SetMouseCursor(new_cursor_name);
			cursor_name = new_cursor_name;
		}
	}

	// Build the new hover chain.
	ElementSet new_hover_chain;
	Element* element = hover;
	while (element != nullptr)
	{
		new_hover_chain.insert(element);
		element = element->GetParentNode();
	}

	// Send mouseout / mouseover events.
	SendEvents(hover_chain, new_hover_chain, EventId::Mouseout, parameters);
	SendEvents(new_hover_chain, hover_chain, EventId::Mouseover, parameters);

	// Send out drag events.
	if (drag && mouse_active)
	{
		drag_hover = GetElementAtPoint(position, drag);

		ElementSet new_drag_hover_chain;
		element = drag_hover;
		while (element != nullptr)
		{
			new_drag_hover_chain.insert(element);
			element = element->GetParentNode();
		}

		if (drag_started && drag_verbose)
		{
			// Send out ondragover and ondragout events as appropriate.
			SendEvents(drag_hover_chain, new_drag_hover_chain, EventId::Dragout, drag_parameters);
			SendEvents(new_drag_hover_chain, drag_hover_chain, EventId::Dragover, drag_parameters);
		}

		drag_hover_chain.swap(new_drag_hover_chain);
	}

	// Swap the new chain in.
	hover_chain.swap(new_hover_chain);
}